

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O0

void secp256k1_ecmult_table_get_ge_lambda
               (secp256k1_ge *r,secp256k1_ge *pre,secp256k1_fe *x,int n,int w)

{
  int in_ECX;
  secp256k1_ge *in_RSI;
  long in_RDI;
  int in_R8D;
  secp256k1_fe *in_stack_ffffffffffffffc8;
  secp256k1_ge *in_stack_ffffffffffffffd0;
  
  secp256k1_ecmult_table_verify(in_ECX,in_R8D);
  if (in_ECX < 1) {
    secp256k1_ge_set_xy(in_RSI,in_stack_ffffffffffffffc8,(secp256k1_fe *)0x48919a);
    secp256k1_fe_impl_negate_unchecked
              ((secp256k1_fe *)(in_RDI + 0x28),(secp256k1_fe *)(in_RDI + 0x28),1);
  }
  else {
    secp256k1_ge_set_xy(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(secp256k1_fe *)0x489142
                       );
  }
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_ecmult_table_get_ge_lambda(secp256k1_ge *r, const secp256k1_ge *pre, const secp256k1_fe *x, int n, int w) {
    secp256k1_ecmult_table_verify(n,w);
    if (n > 0) {
        secp256k1_ge_set_xy(r, &x[(n-1)/2], &pre[(n-1)/2].y);
    } else {
        secp256k1_ge_set_xy(r, &x[(-n-1)/2], &pre[(-n-1)/2].y);
        secp256k1_fe_negate(&(r->y), &(r->y), 1);
    }
}